

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::uhugeint_t>
          (TryCast *this,string_t input,uhugeint_t *result,bool strict)

{
  ulong uVar1;
  char cVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  idx_t pos;
  ulong uVar7;
  ulong uVar8;
  byte c;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  ExponentData exponent;
  byte local_c4;
  HugeIntCastData<duckdb::uhugeint_t,_duckdb::Uhugeint,_unsigned_long> local_98;
  string_t input_local;
  
  input_local.value.pointer.ptr = input.value._0_8_;
  pcVar11 = input.value._0_8_;
  if ((uint)this < 0xd) {
    pcVar11 = input_local.value.pointer.prefix;
  }
  uVar8 = (ulong)this & 0xffffffff;
  uVar13 = 0;
  while( true ) {
    uVar12 = uVar8 - uVar13;
    if (uVar12 == 0) {
      return false;
    }
    bVar6 = pcVar11[uVar13];
    if ((0x20 < (ulong)bVar6) || ((0x100003e00U >> ((ulong)bVar6 & 0x3f) & 1) == 0)) break;
    uVar13 = uVar13 + 1;
  }
  local_98.decimal_intermediate.upper = 0;
  local_98.decimal_intermediate_digits = 0;
  local_98._74_6_ = 0;
  local_98.decimal_total_digits = 0;
  local_98._50_6_ = 0;
  local_98.decimal_intermediate.lower = 0;
  local_98.decimal.lower = 0;
  local_98.decimal.upper = 0;
  local_98.intermediate = 0;
  local_98.digits = '\0';
  local_98._25_7_ = 0;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  local_c4 = (byte)result;
  input_local.value._0_8_ = this;
  if (bVar6 == 0x2d) {
    uVar7 = 1;
    while (uVar7 < uVar12) {
      lVar3 = uVar13 + uVar7;
      uVar7 = uVar7 + 1;
      if (pcVar11[lVar3] != '0') {
        return false;
      }
    }
    uVar7 = 1;
    while (uVar10 = uVar7, uVar7 = uVar10, uVar10 < uVar12) {
      bVar6 = pcVar11[uVar13 + uVar10];
      if (9 < (byte)(bVar6 - 0x30)) {
        if (bVar6 != 0x2e) goto LAB_01651fbb;
        if (local_c4 != 0) {
          return false;
        }
        uVar9 = uVar10 + 1;
        uVar1 = uVar9;
        goto LAB_01651dfc;
      }
      bVar5 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                        (&local_98,bVar6 - 0x30);
      if (!bVar5) {
        return false;
      }
      uVar7 = uVar12;
      if ((~uVar10 + uVar8 != uVar13) &&
         (uVar7 = uVar10 + 1, pcVar11[uVar13 + 1 + uVar10] == '_' && local_c4 == 0)) {
        if ((uVar8 - uVar10) - 2 == uVar13) {
          return false;
        }
        uVar7 = uVar10 + 2;
        if (9 < (byte)(pcVar11[uVar13 + 2 + uVar10] - 0x30U)) {
          return false;
        }
      }
    }
LAB_01651dc1:
    bVar5 = HugeIntegerCastOperation::
            Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                      (&local_98);
    if (!bVar5) {
      return false;
    }
    if (uVar7 < 2) {
      return false;
    }
    goto LAB_01651eda;
  }
  if ((uVar8 - 1 == uVar13) || (bVar6 != 0x30)) {
    if ((bVar6 == 0x2b & local_c4) != 0) {
      return false;
    }
    uVar10 = (ulong)(bVar6 == 0x2b);
    uVar7 = uVar10;
LAB_01651d01:
    while (uVar9 = uVar7, uVar7 = uVar9, uVar9 < uVar12) {
      bVar6 = pcVar11[uVar13 + uVar9];
      if (9 < (byte)(bVar6 - 0x30)) {
        if (bVar6 != 0x2e) goto LAB_0165200c;
        if (local_c4 != 0) {
          return false;
        }
        uVar1 = uVar9 + 1;
        uVar4 = uVar1;
        goto LAB_01651f19;
      }
      bVar5 = HugeIntegerCastOperation::
              HandleDigit<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                        (&local_98,bVar6 - 0x30);
      if (!bVar5) {
        return false;
      }
      uVar7 = uVar12;
      if ((~uVar9 + uVar8 != uVar13) &&
         (uVar7 = uVar9 + 1, pcVar11[uVar13 + 1 + uVar9] == '_' && local_c4 == 0)) {
        if ((uVar8 - uVar9) - 2 == uVar13) {
          return false;
        }
        uVar7 = uVar9 + 2;
        if (9 < (byte)(pcVar11[uVar13 + 2 + uVar9] - 0x30U)) {
          return false;
        }
      }
    }
LAB_01651eb8:
    bVar5 = HugeIntegerCastOperation::
            Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                      (&local_98);
    if (!bVar5) {
      return false;
    }
    if (uVar7 <= uVar10) {
      return false;
    }
LAB_01651eda:
    *input.value._8_8_ = local_98.result.lower;
    input.value._8_8_[1] = local_98.result.upper;
    return true;
  }
  cVar2 = pcVar11[uVar13 + 1];
  if (cVar2 == 'B') {
LAB_01651d93:
    if ((uVar8 - uVar13) - 3 < 0xfffffffffffffffe) {
      return false;
    }
  }
  else {
    if (cVar2 != 'x') {
      if (cVar2 == 'b') goto LAB_01651d93;
      if (cVar2 != 'X') {
        if (((byte)(cVar2 - 0x30U) < 10 & local_c4) != 0) {
          return false;
        }
        uVar10 = 0;
        uVar7 = uVar10;
        goto LAB_01651d01;
      }
    }
    if (1 < ~uVar13 + uVar8) {
      bVar6 = pcVar11[uVar13 + 2];
      c = bVar6 | 0x20;
      if (0x19 < (byte)(bVar6 + 0xbf)) {
        c = bVar6;
      }
      bVar5 = StringUtil::CharacterIsHex(c);
      if (uVar8 - 3 == uVar13) {
        return false;
      }
      if (!bVar5) {
        return false;
      }
      if (uVar8 - 4 != uVar13) {
        if (pcVar11[uVar13 + 3] == '_') {
          StringUtil::CharacterIsHex(pcVar11[uVar13 + 4]);
          return false;
        }
        return false;
      }
      return false;
    }
  }
  HugeIntegerCastOperation::
  Finalize<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
            (&local_98);
  return false;
LAB_01651dfc:
  uVar7 = uVar1;
  if (uVar7 < uVar12) {
    bVar6 = pcVar11[uVar13 + uVar7];
    if ((byte)(bVar6 - 0x30) < 10) goto code_r0x01651e21;
    if (uVar7 <= uVar9 && uVar10 < 2) {
      return false;
    }
LAB_01651fbb:
    if (bVar6 - 9 < 5) {
LAB_01651fca:
      uVar8 = uVar7 + 1;
      uVar7 = uVar8;
      if (uVar8 < uVar12) {
        uVar7 = uVar12;
      }
      for (; uVar8 < uVar12; uVar8 = uVar8 + 1) {
        if (0x20 < (ulong)(byte)pcVar11[uVar13 + uVar8]) {
          return false;
        }
        if ((0x100003e00U >> ((ulong)(byte)pcVar11[uVar13 + uVar8] & 0x3f) & 1) == 0) {
          return false;
        }
      }
      goto LAB_01651dc1;
    }
    if ((bVar6 != 0x65) && (bVar6 != 0x45)) {
      if (bVar6 != 0x20) {
        return false;
      }
      goto LAB_01651fca;
    }
    if (uVar7 == 1 || local_c4 != 0) {
      return false;
    }
    if (uVar12 <= uVar7 + 1) {
      return false;
    }
    exponent.result = 0;
    pcVar11 = pcVar11 + uVar13 + uVar7 + 1;
    iVar14 = ~uVar13 + (uVar8 - uVar7);
    if (*pcVar11 == '-') {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar11,iVar14,&exponent,false);
    }
    else {
      bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar11,iVar14,&exponent,false);
    }
    if (bVar5 == false) {
      return false;
    }
    bVar5 = HugeIntegerCastOperation::
            HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true>
                      (&local_98,(int)exponent.result);
    goto LAB_016521f1;
  }
  if (uVar7 <= uVar9 && uVar10 < 2) {
    return false;
  }
  goto LAB_01651dc1;
code_r0x01651e21:
  bVar5 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,true,true>
                    (&local_98,bVar6 - 0x30);
  if (!bVar5) {
    return false;
  }
  uVar1 = uVar12;
  if ((~uVar7 + uVar8 != uVar13) && (uVar1 = uVar7 + 1, pcVar11[uVar13 + 1 + uVar7] == '_')) {
    if ((uVar8 - uVar7) - 2 == uVar13) {
      return false;
    }
    uVar1 = uVar7 + 2;
    if (9 < (byte)(pcVar11[uVar13 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01651dfc;
LAB_01651f19:
  uVar7 = uVar4;
  if (uVar7 < uVar12) {
    bVar6 = pcVar11[uVar13 + uVar7];
    if ((byte)(bVar6 - 0x30) < 10) goto code_r0x01651f3e;
    if (uVar7 <= uVar1 && uVar9 <= uVar10) {
      return false;
    }
LAB_0165200c:
    if (4 < bVar6 - 9) {
      if ((bVar6 == 0x65) || (bVar6 == 0x45)) {
        if (uVar7 == uVar10 || local_c4 != 0) {
          return false;
        }
        if (uVar12 <= uVar7 + 1) {
          return false;
        }
        exponent.result = 0;
        pcVar11 = pcVar11 + uVar13 + uVar7 + 1;
        iVar14 = ~uVar13 + (uVar8 - uVar7);
        if (*pcVar11 == '-') {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar11,iVar14,&exponent,false);
        }
        else {
          bVar5 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                            (pcVar11,iVar14,&exponent,false);
        }
        if (bVar5 == false) {
          return false;
        }
        bVar5 = HugeIntegerCastOperation::
                HandleExponent<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false>
                          (&local_98,(int)exponent.result);
LAB_016521f1:
        if (bVar5 == false) {
          return false;
        }
        goto LAB_01651eda;
      }
      if (bVar6 != 0x20) {
        return false;
      }
    }
    uVar8 = uVar7 + 1;
    uVar7 = uVar8;
    if (uVar8 < uVar12) {
      uVar7 = uVar12;
    }
    for (; uVar8 < uVar12; uVar8 = uVar8 + 1) {
      if (0x20 < (ulong)(byte)pcVar11[uVar13 + uVar8]) {
        return false;
      }
      if ((0x100003e00U >> ((ulong)(byte)pcVar11[uVar13 + uVar8] & 0x3f) & 1) == 0) {
        return false;
      }
    }
  }
  else if (uVar7 <= uVar1 && uVar9 <= uVar10) {
    return false;
  }
  goto LAB_01651eb8;
code_r0x01651f3e:
  bVar5 = HugeIntegerCastOperation::
          HandleDecimal<duckdb::HugeIntCastData<duckdb::uhugeint_t,duckdb::Uhugeint,unsigned_long>,false,true>
                    (&local_98,bVar6 - 0x30);
  if (!bVar5) {
    return false;
  }
  uVar4 = uVar12;
  if ((~uVar7 + uVar8 != uVar13) && (uVar4 = uVar7 + 1, pcVar11[uVar13 + 1 + uVar7] == '_')) {
    if ((uVar8 - uVar7) - 2 == uVar13) {
      return false;
    }
    uVar4 = uVar7 + 2;
    if (9 < (byte)(pcVar11[uVar13 + 2 + uVar7] - 0x30U)) {
      return false;
    }
  }
  goto LAB_01651f19;
}

Assistant:

bool TryCast::Operation(string_t input, uhugeint_t &result, bool strict) {
	HugeIntCastData<uhugeint_t, Uhugeint, uint64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<uhugeint_t, Uhugeint, uint64_t>, false, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}